

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O3

void __thiscall
ArgumentParser::Instance::
Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
          (Instance *this,
          cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *args,size_t pos)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string_view arg;
  
  pbVar1 = (args->End)._M_current;
  for (pbVar2 = (args->Begin)._M_current; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    arg._M_str = (pbVar2->_M_dataplus)._M_p;
    arg._M_len = pbVar2->_M_string_length;
    Consume(this,pos,arg);
    pos = pos + 1;
  }
  FinishKeyword(this);
  return;
}

Assistant:

void Parse(Range const& args, std::size_t pos = 0)
  {
    for (cm::string_view arg : args) {
      this->Consume(pos++, arg);
    }
    this->FinishKeyword();
  }